

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

void handle_busy_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  anomalous_callbacks *cbs;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__format;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  shared_data data;
  fdb_iterator *itr;
  char bodybuf [16];
  char metabuf [16];
  char keybuf [16];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_file_handle *local_2b8;
  fdb_kvs_handle *pfStack_2b0;
  fdb_iterator *local_2a8;
  long lStack_2a0;
  fdb_iterator *local_290;
  char local_288 [16];
  char local_278 [16];
  char local_268 [24];
  fdb_kvs_config local_250;
  timeval local_238;
  fdb_doc *local_228 [32];
  fdb_config local_128;
  
  gettimeofday(&local_238,(__timezone_ptr_t)0x0);
  memleak_start();
  cbs = get_default_anon_cbs();
  cbs->pwrite_cb = pwrite_hang_cb;
  system("rm -rf  anomaly_test* > errorlog.txt");
  local_2b8 = (fdb_file_handle *)0x0;
  pfStack_2b0 = (fdb_kvs_handle *)0x0;
  local_2a8 = (fdb_iterator *)0x0;
  lStack_2a0._0_1_ = 0;
  lStack_2a0._1_7_ = 0;
  filemgr_ops_anomalous_init(cbs,&local_2b8);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = '\x01';
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  fVar1 = fdb_open(&local_2b8,"anomaly_test5",&local_128);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(local_2b8,&pfStack_2b0,&local_250);
    handle = pfStack_2b0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00107a43;
    lVar6 = 0;
    uVar5 = 0;
    do {
      sprintf(local_268,"key%d",uVar5 & 0xffffffff);
      sprintf(local_278,"meta%d",uVar5 & 0xffffffff);
      sprintf(local_288,"body%d",uVar5 & 0xffffffff);
      sVar2 = strlen(local_268);
      sVar3 = strlen(local_278);
      sVar4 = strlen(local_288);
      fdb_doc_create((fdb_doc **)((long)local_228 + lVar6),local_268,sVar2 + 1,local_278,sVar3 + 1,
                     local_288,sVar4 + 1);
      fVar1 = fdb_set(handle,local_228[uVar5]);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        handle_busy_test();
        goto LAB_00107a3e;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar5 != 0x20);
    fVar1 = fdb_commit(local_2b8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00107a48;
    fVar1 = fdb_iterator_init(handle,&local_290,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      lStack_2a0._0_1_ = 1;
      fVar1 = fdb_set(handle,local_228[0]);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        local_2a8 = local_290;
        fdb_iterator_close(local_290);
        lStack_2a0 = (ulong)lStack_2a0._1_7_ << 8;
        fdb_close(local_2b8);
        lVar6 = 0x1f;
        do {
          fdb_doc_free(local_228[lVar6]);
          bVar7 = lVar6 != 0;
          lVar6 = lVar6 + -1;
        } while (bVar7);
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (handle_busy_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"Handle Busy Test");
        return;
      }
      goto LAB_00107a52;
    }
  }
  else {
LAB_00107a3e:
    handle_busy_test();
LAB_00107a43:
    handle_busy_test();
LAB_00107a48:
    handle_busy_test();
  }
  handle_busy_test();
LAB_00107a52:
  handle_busy_test();
  return;
}

Assistant:

void handle_busy_test()
{
    TEST_INIT();

    memleak_start();

    int n = 32;
    int i = 0, r;

    char keybuf[16], metabuf[16], bodybuf[16];
    fdb_doc **doc = alca(fdb_doc *, n);
    struct shared_data data;
    fdb_kvs_handle *db;
    fdb_iterator *itr;
    fdb_status status;

    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_hang_cb = get_default_anon_cbs();

    // Modify the pwrite callback to redirect to test-specific function
    write_hang_cb->pwrite_cb = &pwrite_hang_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    memset(&data, 0, sizeof(struct shared_data));

    // Create anomalous behavior with shared handle for the callback ctx
    filemgr_ops_anomalous_init(write_hang_cb, &data);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&data.dbfile, "anomaly_test5", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(data.dbfile, &data.db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    db = data.db;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1,
            (void*)metabuf, strlen(metabuf) + 1, (void*)bodybuf,
            strlen(bodybuf) + 1);
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    status = fdb_commit(data.dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_iterator_init(db, &itr, NULL, 0, NULL, 0,
                               FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Set callback context to call bad_thread() and do a set invoking callback
    data.test_handle_busy = 1;
    status = fdb_set(db, doc[0]);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test iterator callbacks by attemping a set call on the iterator handle..
    data.iterator = itr;
    // TODO: remove if concurrent access on iterator handle can never happen
    //status = fdb_set(itr->handle, doc[0]);
    //TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_iterator_close(itr);
    data.test_handle_busy = 0;
    fdb_close(data.dbfile);

    for (i = n - 1; i >=0; --i) {
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Handle Busy Test");
}